

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::Clamp(Bignum *this)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = (long)this->used_digits_;
  if (0 < lVar3) {
    puVar1 = (this->bigits_).start_;
    do {
      if (puVar1[lVar3 + -1] != 0) goto LAB_00287935;
      this->used_digits_ = (int)lVar3 + -1;
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
    lVar3 = 0;
  }
LAB_00287935:
  if ((int)lVar3 != 0) {
    return;
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}